

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O1

void __thiscall Material::setAlbedoTexture(Material *this,string *filePath)

{
  Texture *this_00;
  _Head_base<0UL,_fw::Texture_*,_false> local_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = (Texture *)operator_new(0x30);
  fw::Texture::Texture(this_00,filePath);
  local_30._M_head_impl = this_00;
  std::__shared_ptr<fw::Texture,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fw::Texture,std::default_delete<fw::Texture>,void>
            ((__shared_ptr<fw::Texture,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_> *)&local_30);
  (this->_albedoTexture).super___shared_ptr<fw::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_albedoTexture).super___shared_ptr<fw::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_20);
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  if (local_30._M_head_impl != (Texture *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Texture[1])();
  }
  return;
}

Assistant:

void Material::setAlbedoTexture(std::string filePath) {
    setAlbedoTexture(std::make_unique<fw::Texture>(filePath));
}